

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# node.cpp
# Opt level: O1

void duckdb::Node::New(ART *art,Node *node,NType type)

{
  InternalException *this;
  undefined7 in_register_00000011;
  string local_60;
  string local_40;
  
  switch((int)CONCAT71(in_register_00000011,type)) {
  case 3:
    BaseNode<(unsigned_char)'\x04',_(duckdb::NType)3>::New(art,node);
    return;
  case 4:
    BaseNode<(unsigned_char)'\x10',_(duckdb::NType)4>::New(art,node);
    return;
  case 5:
    Node48::New(art,node);
    return;
  case 6:
    Node256::New(art,node);
    return;
  default:
    this = (InternalException *)__cxa_allocate_exception(0x10);
    local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_60,"Invalid node type for New: %s.","");
    EnumUtil::ToString<duckdb::NType>(&local_40,type);
    InternalException::InternalException<std::__cxx11::string>(this,&local_60,&local_40);
    __cxa_throw(this,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case 8:
    BaseLeaf<(unsigned_char)'\a',_(duckdb::NType)8>::New(art,node);
    return;
  case 9:
    BaseLeaf<(unsigned_char)'\x0f',_(duckdb::NType)9>::New(art,node);
    return;
  case 10:
    Node256Leaf::New(art,node);
    return;
  }
}

Assistant:

void Node::New(ART &art, Node &node, NType type) {
	switch (type) {
	case NType::NODE_7_LEAF:
		Node7Leaf::New(art, node);
		break;
	case NType::NODE_15_LEAF:
		Node15Leaf::New(art, node);
		break;
	case NType::NODE_256_LEAF:
		Node256Leaf::New(art, node);
		break;
	case NType::NODE_4:
		Node4::New(art, node);
		break;
	case NType::NODE_16:
		Node16::New(art, node);
		break;
	case NType::NODE_48:
		Node48::New(art, node);
		break;
	case NType::NODE_256:
		Node256::New(art, node);
		break;
	default:
		throw InternalException("Invalid node type for New: %s.", EnumUtil::ToString(type));
	}
}